

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawWarpedDecal(PixelGameEngine *this,Decal *decal,vf2d *pos,Pixel *tint)

{
  uint32_t uVar1;
  int i_1;
  ulong uVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float d [4];
  DecalInstance di;
  float local_a8;
  uint32_t uStack_a4;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [32];
  pointer local_68;
  pointer pvStack_60;
  pointer local_58;
  pointer pfStack_50;
  pointer local_48;
  pointer pfStack_40;
  pointer local_38;
  pointer pPStack_30;
  pointer local_28;
  undefined8 uStack_20;
  
  local_28 = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_38 = (pointer)0x0;
  pPStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pfStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pfStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pvStack_60 = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  local_88._24_8_ = (pointer)0x0;
  uStack_20._0_4_ = NORMAL;
  uStack_20._4_4_ = 4;
  uVar1 = (tint->field_0).n;
  _local_a8 = CONCAT44(uVar1,uVar1);
  uStack_a0 = CONCAT44(uVar1,uVar1);
  local_88._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&local_38,&local_a8);
  _local_a8 = 0x3f8000003f800000;
  uStack_a0 = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&pfStack_50,&local_a8);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_88 + 8),4);
  _local_a8 = 0;
  uStack_a0 = 0x3f80000000000000;
  local_98 = 0x3f800000;
  uStack_94 = 0x3f800000;
  uStack_90 = 0x3f800000;
  uStack_8c = 0;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&local_68,
             &local_a8);
  fVar4 = pos->x;
  fVar6 = pos->y;
  fVar5 = pos[2].x - fVar4;
  fVar9 = pos[3].y - pos[1].y;
  fVar7 = pos[3].x - pos[1].x;
  fVar8 = pos[2].y - fVar6;
  fVar10 = fVar5 * fVar9 - fVar8 * fVar7;
  fVar13 = 0.0;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    fVar11 = fVar6 - pos[1].y;
    fVar12 = fVar4 - pos[1].x;
    fVar7 = (fVar7 * fVar11 - fVar9 * fVar12) * (1.0 / fVar10);
    if ((fVar7 < 0.0) || (1.0 < fVar7)) {
      fVar8 = 0.0;
    }
    else {
      fVar9 = (fVar11 * fVar5 - fVar12 * fVar8) * (1.0 / fVar10);
      fVar8 = 0.0;
      if ((0.0 <= fVar9) && (fVar9 <= 1.0)) {
        fVar13 = fVar4 + fVar5 * fVar7;
        fVar8 = (pos[2].y - fVar6) * fVar7 + fVar6;
      }
    }
    lVar3 = 0;
    do {
      fVar4 = pos[lVar3].x - fVar13;
      fVar6 = pos[lVar3].y - fVar8;
      fVar4 = fVar4 * fVar4 + fVar6 * fVar6;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      (&local_a8)[lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar2 = 0;
    do {
      fVar4 = (&local_a8)[uVar2];
      fVar6 = 1.0;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        fVar6 = (fVar4 + (&local_a8)[uVar2 ^ 2]) / (&local_a8)[uVar2 ^ 2];
      }
      local_68[uVar2].x = local_68[uVar2].x * fVar6;
      local_68[uVar2].y = local_68[uVar2].y * fVar6;
      pfStack_50[uVar2] = fVar6 * pfStack_50[uVar2];
      fVar4 = pos[uVar2].x * (this->vInvScreenSize).x;
      fVar6 = pos[uVar2].y * (this->vInvScreenSize).y;
      ((pointer)(local_88._8_8_ + uVar2 * 8))->x = fVar4 + fVar4 + -1.0;
      ((pointer)(local_88._8_8_ + uVar2 * 8))->y = -(fVar6 + fVar6 + -1.0);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 4);
    uStack_20._0_4_ = this->nDecalMode;
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
               (value_type *)local_88);
  }
  if (local_38 != (pointer)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  if (pfStack_50 != (pointer)0x0) {
    operator_delete(pfStack_50,(long)pfStack_40 - (long)pfStack_50);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if ((pointer)local_88._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._8_8_,local_88._24_8_ - local_88._8_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::Pixel &tint)
	{
		// Thanks Nathan Reed, a brilliant article explaining whats going on here
		// http://www.reedbeta.com/blog/quadrilateral-interpolation-part-1/
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}